

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

void ARM_init(MCRegisterInfo *MRI)

{
  MCRegisterInfo *MRI_local;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,ARMRegDesc,0x121,0,0,ARMMCRegisterClasses,100,(uint16_t (*) [2])0x0,0,
             ARMRegDiffLists,(char *)0x0,ARMSubRegIdxLists,0x39,(uint16_t *)0x0);
  return;
}

Assistant:

void ARM_init(MCRegisterInfo *MRI)
{
	/*
	   InitMCRegisterInfo(ARMRegDesc, 289,
	   RA, PC,
	   ARMMCRegisterClasses, 100,
	   ARMRegUnitRoots, 77, ARMRegDiffLists, ARMRegStrings,
	   ARMSubRegIdxLists, 57,
	   ARMSubRegIdxRanges, ARMRegEncodingTable);
	 */

	MCRegisterInfo_InitMCRegisterInfo(MRI, ARMRegDesc, 289,
			0, 0, 
			ARMMCRegisterClasses, 100,
			0, 0, ARMRegDiffLists, 0, 
			ARMSubRegIdxLists, 57,
			0);
}